

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ConvolutionLayerParams::MergeFrom
          (ConvolutionLayerParams *this,ConvolutionLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  WeightParams *pWVar4;
  ValidPadding *pVVar5;
  SamePadding *pSVar6;
  ValidPadding *from_00;
  SamePadding *from_01;
  LogFinisher local_131;
  LogMessage local_130;
  LogMessage local_f8;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_f8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6e09);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_f8,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_f8);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c0,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  iVar1 = (from->kernelsize_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->kernelsize_,iVar1 + (this->kernelsize_).current_size_);
    memcpy(((this->kernelsize_).rep_)->elements + (this->kernelsize_).current_size_,
           ((from->kernelsize_).rep_)->elements,(long)(from->kernelsize_).current_size_ << 3);
    (this->kernelsize_).current_size_ =
         (this->kernelsize_).current_size_ + (from->kernelsize_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar1 = (from->stride_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->stride_,iVar1 + (this->stride_).current_size_);
    memcpy(((this->stride_).rep_)->elements + (this->stride_).current_size_,
           ((from->stride_).rep_)->elements,(long)(from->stride_).current_size_ << 3);
    (this->stride_).current_size_ = (this->stride_).current_size_ + (from->stride_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->dilationfactor_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->dilationfactor_,iVar1 + (this->dilationfactor_).current_size_);
    memcpy(((this->dilationfactor_).rep_)->elements + (this->dilationfactor_).current_size_,
           ((from->dilationfactor_).rep_)->elements,(long)(from->dilationfactor_).current_size_ << 3
          );
    (this->dilationfactor_).current_size_ =
         (this->dilationfactor_).current_size_ + (from->dilationfactor_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_130,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_130,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_131,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_130);
  }
  iVar1 = (from->outputshape_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->outputshape_,iVar1 + (this->outputshape_).current_size_);
    memcpy(((this->outputshape_).rep_)->elements + (this->outputshape_).current_size_,
           ((from->outputshape_).rep_)->elements,(long)(from->outputshape_).current_size_ << 3);
    (this->outputshape_).current_size_ =
         (this->outputshape_).current_size_ + (from->outputshape_).current_size_;
  }
  if ((from != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) &&
     (from->weights_ != (WeightParams *)0x0)) {
    if (this->weights_ == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar4);
      this->weights_ = pWVar4;
    }
    pWVar4 = from->weights_;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->weights_,pWVar4);
  }
  if ((from != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) &&
     (from->bias_ != (WeightParams *)0x0)) {
    if (this->bias_ == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar4);
      this->bias_ = pWVar4;
    }
    pWVar4 = from->bias_;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->bias_,pWVar4);
  }
  if (from->outputchannels_ != 0) {
    this->outputchannels_ = from->outputchannels_;
  }
  if (from->kernelchannels_ != 0) {
    this->kernelchannels_ = from->kernelchannels_;
  }
  if (from->ngroups_ != 0) {
    this->ngroups_ = from->ngroups_;
  }
  if (from->isdeconvolution_ == true) {
    this->isdeconvolution_ = true;
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  if (from->_oneof_case_[0] == 0x33) {
    if (this->_oneof_case_[0] != 0x33) {
      clear_ConvolutionPaddingType(this);
      this->_oneof_case_[0] = 0x33;
      pSVar6 = (SamePadding *)operator_new(0x18);
      SamePadding::SamePadding(pSVar6);
      (this->ConvolutionPaddingType_).same_ = pSVar6;
    }
    pSVar6 = (this->ConvolutionPaddingType_).same_;
    if (from->_oneof_case_[0] == 0x33) {
      from_01 = (from->ConvolutionPaddingType_).same_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (SamePadding *)&_SamePadding_default_instance_;
    }
    SamePadding::MergeFrom(pSVar6,from_01);
  }
  else if (from->_oneof_case_[0] == 0x32) {
    if (this->_oneof_case_[0] != 0x32) {
      clear_ConvolutionPaddingType(this);
      this->_oneof_case_[0] = 0x32;
      pVVar5 = (ValidPadding *)operator_new(0x20);
      ValidPadding::ValidPadding(pVVar5);
      (this->ConvolutionPaddingType_).valid_ = pVVar5;
    }
    pVVar5 = (this->ConvolutionPaddingType_).valid_;
    if (from->_oneof_case_[0] == 0x32) {
      from_00 = (from->ConvolutionPaddingType_).valid_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (ValidPadding *)&_ValidPadding_default_instance_;
    }
    ValidPadding::MergeFrom(pVVar5,from_00);
  }
  return;
}

Assistant:

void ConvolutionLayerParams::MergeFrom(const ConvolutionLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ConvolutionLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  kernelsize_.MergeFrom(from.kernelsize_);
  stride_.MergeFrom(from.stride_);
  dilationfactor_.MergeFrom(from.dilationfactor_);
  outputshape_.MergeFrom(from.outputshape_);
  if (from.has_weights()) {
    mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from.weights());
  }
  if (from.has_bias()) {
    mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from.bias());
  }
  if (from.outputchannels() != 0) {
    set_outputchannels(from.outputchannels());
  }
  if (from.kernelchannels() != 0) {
    set_kernelchannels(from.kernelchannels());
  }
  if (from.ngroups() != 0) {
    set_ngroups(from.ngroups());
  }
  if (from.isdeconvolution() != 0) {
    set_isdeconvolution(from.isdeconvolution());
  }
  if (from.hasbias() != 0) {
    set_hasbias(from.hasbias());
  }
  switch (from.ConvolutionPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
}